

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O2

void assetsys_internal_remove_collated(assetsys_t *sys,int index)

{
  int iVar1;
  assetsys_internal_collated_t *paVar2;
  
  iVar1 = sys->collated[index].ref_count;
  if (iVar1 < 1) {
    __assert_fail("coll->ref_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/assetsys.h"
                  ,0x1798,"void assetsys_internal_remove_collated(assetsys_t *, const int)");
  }
  paVar2 = sys->collated + index;
  iVar1 = iVar1 + -1;
  paVar2->ref_count = iVar1;
  if (iVar1 != 0) {
    return;
  }
  strpool_decref(&sys->strpool,paVar2->path);
  strpool_discard(&sys->strpool,paVar2->path);
  return;
}

Assistant:

static void assetsys_internal_remove_collated( assetsys_t* sys, int const index )
    {
    struct assetsys_internal_collated_t* coll = &sys->collated[ index ];
    ASSETSYS_ASSERT( coll->ref_count > 0 );
    --coll->ref_count;
    if( coll->ref_count == 0 )
        {
        strpool_decref( &sys->strpool, coll->path );
        strpool_discard( &sys->strpool, coll->path );
        }
    }